

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

void henson_load_array(char *name,void **address,size_t *type,size_t *count,size_t *stride)

{
  void *pvVar1;
  size_t *in_RCX;
  size_t *in_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  size_t *in_R8;
  Array a;
  Array *in_stack_ffffffffffffff00;
  allocator local_c1;
  string *in_stack_ffffffffffffff40;
  NameMap *in_stack_ffffffffffffff48;
  Array local_60;
  size_t *local_28;
  size_t *local_20;
  size_t *local_18;
  undefined8 *local_10;
  
  if (namemap != (NameMap *)0x0) {
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff40,in_RDI,&local_c1);
    henson::NameMap::get(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    mpark::
    get<henson::Array,int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>
              ((variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x14c2fc);
    henson::Array::Array(in_stack_ffffffffffffff00,&local_60);
    mpark::
    variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x14c323);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    pvVar1 = henson::Array::void_ptr(in_stack_ffffffffffffff00);
    *local_10 = pvVar1;
    *local_18 = local_60.type;
    *local_20 = local_60.count;
    *local_28 = local_60.stride;
    henson::Array::~Array((Array *)0x14c39d);
  }
  return;
}

Assistant:

void
henson_load_array(const char* name, void** address, size_t* type, size_t* count, size_t* stride)
{
    if (!namemap) return;

    henson::Array a = henson::get<henson::Array>(namemap->get(name));
    *address = a.void_ptr();
    *type    = a.type;
    *count   = a.count;
    *stride  = a.stride;
}